

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font.cpp
# Opt level: O3

void __thiscall dpfb::Font::readKerningPairs(Font *this)

{
  pointer *ppKVar1;
  ushort uVar2;
  iterator __position;
  KerningSource KVar3;
  char32_t cVar4;
  char32_t cVar5;
  ulong uVar6;
  ulong uVar7;
  pointer pRVar8;
  ulong uVar9;
  pointer pRVar10;
  pointer pRVar11;
  KerningParams kerningParams;
  vector<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_> local_58;
  KerningParams local_40;
  vector<dpfb::KerningPair,_std::allocator<dpfb::KerningPair>_> *local_38;
  
  local_40.pxSize = (this->bakingOptions).fontPxSize;
  local_40.pxPerEm = (int)(this->head).unitsPerEm;
  KVar3 = (this->bakingOptions).kerningSource;
  if ((KVar3 & ~kern) == gpos) {
    readKerningPairsGpos
              (&local_58,&(this->fontStream).super_Stream,&this->sfntOffsetTable,&local_40);
    KVar3 = (this->bakingOptions).kerningSource;
    pRVar8 = local_58.
             super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>._M_impl
             .super__Vector_impl_data._M_finish;
    pRVar11 = local_58.
              super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>.
              _M_impl.super__Vector_impl_data._M_start;
  }
  else {
    pRVar11 = (pointer)0x0;
    pRVar8 = (pointer)0x0;
  }
  if ((KVar3 == kern) || ((pRVar10 = pRVar11, KVar3 == kernAndGpos && (pRVar11 == pRVar8)))) {
    readKerningPairsKern
              (&local_58,&(this->fontStream).super_Stream,&this->sfntOffsetTable,&local_40);
    pRVar8 = local_58.
             super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>._M_impl
             .super__Vector_impl_data._M_finish;
    pRVar10 = local_58.
              super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>.
              _M_impl.super__Vector_impl_data._M_start;
    local_58.super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if ((pRVar11 != (pointer)0x0) &&
       (operator_delete(pRVar11),
       local_58.super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>.
       _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
      operator_delete(local_58.
                      super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (pRVar10 == pRVar8) {
    if (pRVar10 == (pointer)0x0) {
      return;
    }
  }
  else {
    sortGlyphs(this,glyphIdx);
    uVar9 = (long)pRVar8 - (long)pRVar10 >> 3;
    local_38 = &this->kerningPairs;
    uVar6 = 0;
    do {
      if (pRVar10[uVar6].amount == 0) {
        __assert_fail("rawKerningPair.amount != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/danpla[P]dpfontbaker/src/font.cpp"
                      ,0x27a,"void dpfb::Font::readKerningPairs()");
      }
      uVar2 = pRVar10[uVar6].glyphIdx1;
      cVar4 = glyphIdxToCp(this,(uint)uVar2);
      if (uVar6 < uVar9) {
        while (pRVar10[uVar6].glyphIdx1 == uVar2) {
          if (pRVar10[uVar6].amount == 0) {
            __assert_fail("rawKerningPair.amount != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/danpla[P]dpfontbaker/src/font.cpp"
                          ,0x28b,"void dpfb::Font::readKerningPairs()");
          }
          uVar7 = uVar6 + 1;
          if ((cVar4 != L'\0') &&
             (cVar5 = glyphIdxToCp(this,(uint)pRVar10[uVar6].glyphIdx2), cVar5 != L'\0')) {
            local_58.super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(cVar5,cVar4);
            local_58.super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 (pointer)CONCAT44(local_58.
                                   super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>
                                   ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                   pRVar10[uVar6].amount);
            __position._M_current =
                 (this->kerningPairs).
                 super__Vector_base<dpfb::KerningPair,_std::allocator<dpfb::KerningPair>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (this->kerningPairs).
                super__Vector_base<dpfb::KerningPair,_std::allocator<dpfb::KerningPair>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<dpfb::KerningPair,_std::allocator<dpfb::KerningPair>_>::
              _M_realloc_insert<dpfb::KerningPair>(local_38,__position,(KerningPair *)&local_58);
            }
            else {
              (__position._M_current)->amount = pRVar10[uVar6].amount;
              *(pointer *)__position._M_current =
                   local_58.
                   super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>.
                   _M_impl.super__Vector_impl_data._M_start;
              ppKVar1 = &(this->kerningPairs).
                         super__Vector_base<dpfb::KerningPair,_std::allocator<dpfb::KerningPair>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
              *ppKVar1 = *ppKVar1 + 1;
            }
          }
          uVar6 = uVar7;
          if (uVar9 == uVar7) goto LAB_0010e411;
        }
      }
    } while (uVar6 < uVar9);
  }
LAB_0010e411:
  operator_delete(pRVar10);
  return;
}

Assistant:

void Font::readKerningPairs()
{
    const KerningParams kerningParams {
        bakingOptions.fontPxSize,
        head.unitsPerEm
    };

    std::vector<RawKerningPair> rawKerningPairs;
    if (bakingOptions.kerningSource == KerningSource::gpos
            || bakingOptions.kerningSource == KerningSource::kernAndGpos)
        rawKerningPairs = readKerningPairsGpos(
            fontStream, sfntOffsetTable, kerningParams);

    // According to the OpenType manual, the "kern" table should be
    // applied when there is no GPOS table, or if the GPOS table doesn't
    // contain any "kern" features for the resolved language.
    // https://docs.microsoft.com/en-us/typography/opentype/spec/recom
    if (bakingOptions.kerningSource == KerningSource::kern
            || (bakingOptions.kerningSource == KerningSource::kernAndGpos
                && rawKerningPairs.empty()))
        rawKerningPairs = readKerningPairsKern(
            fontStream, sfntOffsetTable, kerningParams);
    if (rawKerningPairs.empty())
        return;

    // Prepare for binary search
    sortGlyphs(GlyphsOrder::glyphIdx);

    std::size_t i = 0;
    while (i < rawKerningPairs.size()) {
        const auto& rawKerningPair = rawKerningPairs[i];

        assert(rawKerningPair.amount != 0);

        const auto glyphIdx1 = rawKerningPair.glyphIdx1;
        const auto cp1 = glyphIdxToCp(glyphIdx1);

        // The raw pairs are grouped by the first glyph index (but
        // not necessarily fully sorted in case of GPOS as we read
        // pairs for multiple languages), so we can avoid calling
        // glyphIdxToCp() every time for the first code point in a
        // sequence.
        while (i < rawKerningPairs.size()) {
            const auto& rawKerningPair = rawKerningPairs[i];
            if (rawKerningPair.glyphIdx1 != glyphIdx1)
                break;

            ++i;

            assert(rawKerningPair.amount != 0);

            if (cp1 == 0)
                continue;

            const auto cp2 = glyphIdxToCp(rawKerningPair.glyphIdx2);
            if (cp2 == 0)
                continue;

            kerningPairs.push_back({cp1, cp2, rawKerningPair.amount});
        }
    }
}